

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-eval-util.hh
# Opt level: O2

vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *
tinyusdz::lerp<tinyusdz::value::quatf>
          (vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
           *__return_storage_ptr__,
          vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *a,
          vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *b,double t)

{
  ulong uVar1;
  ulong __new_size;
  long lVar2;
  bool bVar3;
  quatf qVar4;
  
  (__return_storage_ptr__->
  super__Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar1 = (long)(a->
                super__Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>)
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(a->
                super__Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>)
                ._M_impl.super__Vector_impl_data._M_start >> 4;
  __new_size = (long)(b->
                     super__Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(b->
                     super__Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                     )._M_impl.super__Vector_impl_data._M_start >> 4;
  if (uVar1 <= __new_size) {
    __new_size = uVar1;
  }
  if (__new_size != 0) {
    ::std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>::resize
              (__return_storage_ptr__,__new_size);
    if ((long)(a->
              super__Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>).
              _M_impl.super__Vector_impl_data._M_finish -
        (long)(a->
              super__Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>).
              _M_impl.super__Vector_impl_data._M_start ==
        (long)(b->
              super__Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>).
              _M_impl.super__Vector_impl_data._M_finish -
        (long)(b->
              super__Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>).
              _M_impl.super__Vector_impl_data._M_start) {
      lVar2 = 0;
      while (bVar3 = __new_size != 0, __new_size = __new_size - 1, bVar3) {
        qVar4 = lerp<tinyusdz::value::quatf>
                          ((quatf *)((long)(((a->
                                             super__Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                                             )._M_impl.super__Vector_impl_data._M_start)->imag).
                                           _M_elems + lVar2),
                           (quatf *)((long)(((b->
                                             super__Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                                             )._M_impl.super__Vector_impl_data._M_start)->imag).
                                           _M_elems + lVar2),t);
        *(quatf *)((long)(((__return_storage_ptr__->
                           super__Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                           )._M_impl.super__Vector_impl_data._M_start)->imag)._M_elems + lVar2) =
             qVar4;
        lVar2 = lVar2 + 0x10;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<T> lerp(const std::vector<T> &a, const std::vector<T> &b,
                           const double t) {
  std::vector<T> dst;

  // Choose shorter one
  size_t n = std::min(a.size(), b.size());
  if (n == 0) {
    return dst;
  }

  dst.resize(n);

  if (a.size() != b.size()) {
    return dst;
  }
  for (size_t i = 0; i < n; i++) {
    dst[i] = lerp(a[i], b[i], t);
  }

  return dst;
}